

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_buffer.c
# Opt level: O3

error_buffer_t * error_buffer_create(uint num_states)

{
  error_buffer_t *peVar1;
  distance_t *pdVar2;
  distance_t *pdVar3;
  
  peVar1 = (error_buffer_t *)calloc(1,0x30);
  peVar1->num_states = num_states;
  pdVar2 = (distance_t *)calloc(2,(ulong)num_states);
  peVar1->errors[0] = pdVar2;
  pdVar3 = (distance_t *)calloc(2,(ulong)num_states);
  peVar1->errors[1] = pdVar3;
  peVar1->read_errors = pdVar2;
  peVar1->write_errors = pdVar3;
  return peVar1;
}

Assistant:

error_buffer_t *error_buffer_create(unsigned int num_states) {
    error_buffer_t *buf = calloc(1, sizeof(error_buffer_t));

    // how large are the error buffers?
    buf->num_states = num_states;

    // save two error metrics, one for last round and one for this
    // (double buffer)
    // the error metric is the aggregated number of bit errors found
    //   at a given path which terminates at a particular shift register state
    buf->errors[0] = calloc(sizeof(distance_t), num_states);
    buf->errors[1] = calloc(sizeof(distance_t), num_states);

    // which buffer are we using, 0 or 1?
    buf->index = 0;

    buf->read_errors = buf->errors[0];
    buf->write_errors = buf->errors[1];

    return buf;
}